

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

_variable_type __thiscall
gl4cts::FunctionObject::tenaryBase::getArgumentType(tenaryBase *this,GLuint argument)

{
  _variable_type _Var1;
  
  if (argument == 2) {
    _Var1 = this->m_arg_3_type;
  }
  else {
    if (argument == 1) {
      return this->m_arg_2_type;
    }
    _Var1 = VARIABLE_TYPE_UNKNOWN;
    if (argument == 0) {
      return *(_variable_type *)&(this->super_functionObject).field_0x24;
    }
  }
  return _Var1;
}

Assistant:

virtual Utils::_variable_type getArgumentType(glw::GLuint argument) const
	{
		switch (argument)
		{
		case 0:
			return m_arg_1_type;
			break;
		case 1:
			return m_arg_2_type;
			break;
		case 2:
			return m_arg_3_type;
			break;
		default:
			return Utils::VARIABLE_TYPE_UNKNOWN;
			break;
		}
	}